

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

int __thiscall
CVmObjDate::getp_getISOWeekDate(CVmObjDate *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  int32_t iVar2;
  uint uVar3;
  uint uVar4;
  uint *in_RCX;
  vm_val_t *in_RDX;
  int iw;
  int iy;
  caldate_t cd;
  int32_t dayno;
  uint argc;
  CVmTimeZone *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint in_stack_ffffffffffffff98;
  uint n;
  uint argn;
  uint local_50;
  int *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc4;
  
  if (in_RCX == (uint *)0x0) {
    n = 0;
  }
  else {
    n = *in_RCX;
  }
  argn = n;
  if ((getp_getISOWeekDate(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_getISOWeekDate(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_getISOWeekDate::desc,0,1);
    __cxa_guard_release(&getp_getISOWeekDate(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(argn,in_stack_ffffffffffffff98),
                     (uint *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     (CVmNativeCodeDesc *)in_stack_ffffffffffffff88);
  if (iVar1 == 0) {
    get_tz_arg(argn,in_stack_ffffffffffffff98);
    iVar2 = get_local_date((CVmObjDate *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           in_stack_ffffffffffffff88);
    caldate_t::caldate_t
              ((caldate_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (int32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    uVar3 = caldate_t::iso_weekno
                      ((caldate_t *)CONCAT44(in_stack_ffffffffffffffc4,iVar2),
                       in_stack_ffffffffffffffb8);
    uVar4 = caldate_t::iso_weekday((caldate_t *)CONCAT44(local_50,in_stack_ffffffffffffff90));
    make_int_list(in_RDX,3,(ulong)local_50,(ulong)uVar3,(ulong)uVar4);
    CVmStack::discard(n);
  }
  return 1;
}

Assistant:

int CVmObjDate::getp_getISOWeekDate(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get my date in local time */
    int32_t dayno = get_local_date(get_tz_arg(vmg_ 0, argc));

    /* express it as a calendar date */
    caldate_t cd(dayno);

    /* return [iso year, iso week, iso day] */
    int iy;
    int iw = cd.iso_weekno(&iy);
    make_int_list(vmg_ retval, 3, iy, iw, cd.iso_weekday());

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}